

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_CoverDeleteCube_(Mvc_Cover_t *pCover,Mvc_Cube_t *pPrev,Mvc_Cube_t *pCube)

{
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube_local;
  Mvc_Cube_t *pPrev_local;
  Mvc_Cover_t *pCover_local;
  
  if (pPrev == (Mvc_Cube_t *)0x0) {
    (pCover->lCubes).pHead = pCube->pNext;
  }
  else {
    pPrev->pNext = pCube->pNext;
  }
  if ((pCover->lCubes).pTail == pCube) {
    if (pCube->pNext != (Mvc_Cube_t *)0x0) {
      __assert_fail("Mvc_CubeReadNext(pCube) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcList.c"
                    ,0xb7,"void Mvc_CoverDeleteCube_(Mvc_Cover_t *, Mvc_Cube_t *, Mvc_Cube_t *)");
    }
    (pCover->lCubes).pTail = pPrev;
  }
  (pCover->lCubes).nItems = (pCover->lCubes).nItems + -1;
  return;
}

Assistant:

void Mvc_CoverDeleteCube_( Mvc_Cover_t * pCover, Mvc_Cube_t * pPrev, Mvc_Cube_t * pCube )
{
    Mvc_List_t * pList = &pCover->lCubes;
 
    if ( pPrev == NULL ) // deleting the head cube
        pList->pHead = Mvc_CubeReadNext(pCube);
    else
        pPrev->pNext = pCube->pNext;
    if ( pList->pTail == pCube ) // deleting the tail cube
    {
        assert( Mvc_CubeReadNext(pCube) == NULL );
        pList->pTail = pPrev;
    }
    pList->nItems--;
}